

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O0

void __thiscall Graph::removeEdge(Graph *this,int src_idx,int dst_idx)

{
  bool bVar1;
  bool local_71;
  _Self local_48;
  _Self local_40;
  _Self local_38;
  iterator it2;
  iterator it1;
  Node *dst_exist;
  Node *src_exist;
  int dst_idx_local;
  int src_idx_local;
  Graph *this_local;
  
  src_exist._0_4_ = dst_idx;
  src_exist._4_4_ = src_idx;
  _dst_idx_local = this;
  dst_exist = getNode(this,src_idx);
  it1._M_node = (_Base_ptr)getNode(this,(int)src_exist);
  if ((dst_exist == (Node *)0x0) || ((Node *)it1._M_node == (Node *)0x0)) {
    std::operator<<((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n");
  }
  else {
    it2 = std::map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>::
          find(&dst_exist->edges,(key_type *)&it1);
    local_38._M_node =
         (_Base_ptr)
         std::map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>::
         find((map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_> *)
              &(it1._M_node)->_M_left,&dst_exist);
    local_40._M_node =
         (_Base_ptr)
         std::map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>::
         end(&dst_exist->edges);
    bVar1 = std::operator!=(&it2,&local_40);
    local_71 = false;
    if (bVar1) {
      local_48._M_node =
           (_Base_ptr)
           std::map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_>::
           end((map<Node_*,_int,_std::less<Node_*>,_std::allocator<std::pair<Node_*const,_int>_>_> *
               )&(it1._M_node)->_M_left);
      local_71 = std::operator!=(&local_38,&local_48);
    }
    if (local_71 == false) {
      std::operator<<((ostream *)&std::cerr,"Index not found. Couldn\'t remove edge\n");
      exit(0);
    }
    std::map<Node*,int,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>::erase_abi_cxx11_
              ((map<Node*,int,std::less<Node*>,std::allocator<std::pair<Node*const,int>>> *)
               &dst_exist->edges,it2);
    std::map<Node*,int,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>::erase_abi_cxx11_
              ((map<Node*,int,std::less<Node*>,std::allocator<std::pair<Node*const,int>>> *)
               &(it1._M_node)->_M_left,(iterator)local_38._M_node);
  }
  return;
}

Assistant:

void Graph::removeEdge(int src_idx, int dst_idx) {
    auto src_exist = getNode(src_idx);
    auto dst_exist = getNode(dst_idx);

    if(src_exist && dst_exist) {
        auto it1 = src_exist->edges.find(dst_exist);
        auto it2 = dst_exist->edges.find(src_exist);

        if(it1 != src_exist->edges.end() and
            it2 != dst_exist->edges.end()) {
            src_exist->edges.erase(it1);
            dst_exist->edges.erase(it2);
        } else {
            std::cerr << "Index not found. Couldn't remove edge\n";
            exit(0);
        }
    } else {
        std::cerr << "Index not found. Couldn't remove edge\n";
        //exit(0);
    }
}